

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mrg_info.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  __shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2> *this;
  string *__s1;
  pointer pPVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  int iVar3;
  undefined4 extraout_var;
  char *in_RCX;
  uint uVar4;
  string *format;
  ulong uVar5;
  char *pcVar6;
  long lVar7;
  bool bVar8;
  string local_180;
  undefined1 local_160 [8];
  string compress_info;
  string hed_filename;
  undefined1 local_110 [8];
  string name_info;
  string mrg_filename;
  string nam_filename;
  string nam_raw;
  string hed_raw;
  shared_ptr<mg::fs::MappedFile> mrg_data;
  undefined1 auStack_58 [8];
  Nam nam;
  _Head_base<0UL,_mg::data::MappedMrg_*,_false> local_38;
  unique_ptr<mg::data::MappedMrg,_std::default_delete<mg::data::MappedMrg>_> mrg;
  
  format = (string *)0x0;
  mrg_data.super___shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  for (lVar7 = 1; lVar7 < argc; lVar7 = lVar7 + 1) {
    __s1 = (string *)argv[lVar7];
    iVar3 = strcmp((char *)__s1,"--csv");
    if (iVar3 == 0) {
      mrg_data.super___shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             CONCAT71((int7)(CONCAT44(extraout_var,iVar3) >> 8),1);
    }
    else {
      bVar8 = format != (string *)0x0;
      format = __s1;
      if (bVar8) goto LAB_001055ee;
    }
  }
  if (format == (string *)0x0) {
LAB_001055ee:
    usage(*argv);
    iVar3 = -1;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(name_info.field_2._M_local_buf + 8),"%s.hed",
               (allocator<char> *)(nam_raw.field_2._M_local_buf + 8));
    mg::string::format<char_const*>
              ((string *)((long)&compress_info.field_2 + 8),
               (string *)(name_info.field_2._M_local_buf + 8),format,in_RCX);
    _Var2 = mrg_data.super___shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    std::__cxx11::string::~string((string *)(name_info.field_2._M_local_buf + 8));
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(nam_raw.field_2._M_local_buf + 8),"%s.mrg",
               (allocator<char> *)(mrg_filename.field_2._M_local_buf + 8));
    mg::string::format<char_const*>
              ((string *)((long)&name_info.field_2 + 8),(string *)(nam_raw.field_2._M_local_buf + 8)
               ,format,in_RCX);
    std::__cxx11::string::~string((string *)(nam_raw.field_2._M_local_buf + 8));
    nam_raw.field_2._8_8_ = &hed_raw._M_string_length;
    hed_raw._M_dataplus._M_p = (pointer)0x0;
    hed_raw._M_string_length._0_1_ = 0;
    bVar8 = mg::fs::read_file((char *)compress_info.field_2._8_8_,
                              (string *)((long)&nam_raw.field_2 + 8));
    if (bVar8) {
      mg::fs::MappedFile::open(mrg_filename.field_2._M_local_buf + 8,name_info.field_2._8_4_);
      std::__shared_ptr<mg::fs::MappedFile,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<mg::fs::MappedFile,std::default_delete<mg::fs::MappedFile>,void>
                ((__shared_ptr<mg::fs::MappedFile,(__gnu_cxx::_Lock_policy)2> *)
                 (hed_raw.field_2._M_local_buf + 8),
                 (unique_ptr<mg::fs::MappedFile,_std::default_delete<mg::fs::MappedFile>_> *)
                 ((long)&mrg_filename.field_2 + 8));
      std::unique_ptr<mg::fs::MappedFile,_std::default_delete<mg::fs::MappedFile>_>::~unique_ptr
                ((unique_ptr<mg::fs::MappedFile,_std::default_delete<mg::fs::MappedFile>_> *)
                 ((long)&mrg_filename.field_2 + 8));
      if (hed_raw.field_2._8_8_ == 0) {
        iVar3 = -1;
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)(nam_filename.field_2._M_local_buf + 8),"%s.nam",
                   (allocator<char> *)local_110);
        mg::string::format<char_const*>
                  ((string *)((long)&mrg_filename.field_2 + 8),
                   (string *)(nam_filename.field_2._M_local_buf + 8),format,in_RCX);
        std::__cxx11::string::~string((string *)(nam_filename.field_2._M_local_buf + 8));
        nam_filename.field_2._8_8_ = &nam_raw._M_string_length;
        nam_raw._M_dataplus._M_p = (pointer)0x0;
        nam_raw._M_string_length._0_1_ = 0;
        auStack_58 = (undefined1  [8])0x0;
        nam.names.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        nam.names.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        bVar8 = mg::fs::read_file((char *)mrg_filename.field_2._8_8_,
                                  (string *)((long)&nam_filename.field_2 + 8));
        if (bVar8) {
          bVar8 = mg::data::nam_read((string *)((long)&nam_filename.field_2 + 8),(Nam *)auStack_58);
        }
        else {
          bVar8 = false;
        }
        this = (__shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2> *)
               ((long)&hed_filename.field_2 + 8);
        std::__shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (this,(__shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2> *)
                        ((long)&hed_raw.field_2 + 8));
        mg::data::MappedMrg::parse
                  ((MappedMrg *)&local_38,(string *)((long)&nam_raw.field_2 + 8),
                   (shared_ptr<mg::fs::MappedFile> *)this);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xfffffffffffffee8);
        iVar3 = -1;
        if (local_38._M_head_impl != (MappedMrg *)0x0) {
          if ((bVar8 == false) ||
             ((long)((local_38._M_head_impl)->_entries).
                    super__Vector_base<mg::data::Mrg::PackedEntryHeader,_std::allocator<mg::data::Mrg::PackedEntryHeader>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)((local_38._M_head_impl)->_entries).
                    super__Vector_base<mg::data::Mrg::PackedEntryHeader,_std::allocator<mg::data::Mrg::PackedEntryHeader>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3 ==
              (long)nam.names.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start - (long)auStack_58 >> 5)) {
            for (uVar4 = 0; uVar5 = (ulong)uVar4,
                uVar5 < (ulong)((long)((local_38._M_head_impl)->_entries).
                                      super__Vector_base<mg::data::Mrg::PackedEntryHeader,_std::allocator<mg::data::Mrg::PackedEntryHeader>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)((local_38._M_head_impl)->_entries).
                                      super__Vector_base<mg::data::Mrg::PackedEntryHeader,_std::allocator<mg::data::Mrg::PackedEntryHeader>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 3);
                uVar4 = uVar4 + 1) {
              if (bVar8 == false) {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)local_110,"",(allocator<char> *)local_160);
              }
              else {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)local_160,", Name: \'%s\'",(allocator<char> *)&local_180);
                mg::string::format<char_const*>
                          ((string *)local_110,(string *)local_160,
                           (string *)
                           (((pointer)((long)auStack_58 + uVar5 * 0x20))->_M_dataplus)._M_p,
                           (char *)(uVar5 * 0x20));
                std::__cxx11::string::~string((string *)local_160);
              }
              pPVar1 = ((local_38._M_head_impl)->_entries).
                       super__Vector_base<mg::data::Mrg::PackedEntryHeader,_std::allocator<mg::data::Mrg::PackedEntryHeader>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              if (pPVar1[uVar5].size_sectors == pPVar1[uVar5].size_uncompressed_sectors) {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)local_160,"",(allocator<char> *)&local_180);
              }
              else {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_180,", Uncompressed size 0x%08x sectors",
                           (allocator<char> *)
                           ((long)&nam.names.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
                mg::string::format<unsigned_short>
                          ((string *)local_160,&local_180,
                           ((local_38._M_head_impl)->_entries).
                           super__Vector_base<mg::data::Mrg::PackedEntryHeader,_std::allocator<mg::data::Mrg::PackedEntryHeader>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar5].
                           size_uncompressed_sectors);
                std::__cxx11::string::~string((string *)&local_180);
              }
              pPVar1 = ((local_38._M_head_impl)->_entries).
                       super__Vector_base<mg::data::Mrg::PackedEntryHeader,_std::allocator<mg::data::Mrg::PackedEntryHeader>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              if (((ulong)_Var2._M_pi & 1) == 0) {
                printf("Entry %8u: Offset 0x%08x, Size 0x%08x sectors%s%s\n",uVar5,
                       (ulong)pPVar1[uVar5].offset,(ulong)pPVar1[uVar5].size_sectors,local_160,
                       local_110);
              }
              else {
                pcVar6 = "";
                if (bVar8 != false) {
                  pcVar6 = (((pointer)((long)auStack_58 + uVar5 * 0x20))->_M_dataplus)._M_p;
                }
                printf("%u,0x%08x,0x%08x,0x%08x,%s\n",uVar5,(ulong)pPVar1[uVar5].offset,
                       (ulong)pPVar1[uVar5].size_sectors,
                       (ulong)pPVar1[uVar5].size_uncompressed_sectors,pcVar6);
              }
              std::__cxx11::string::~string((string *)local_160);
              std::__cxx11::string::~string((string *)local_110);
            }
            iVar3 = 0;
          }
          else {
            fprintf(_stderr,"MRG entry count (%lu) does not match NAM entry count (%lu)\n");
          }
        }
        std::unique_ptr<mg::data::MappedMrg,_std::default_delete<mg::data::MappedMrg>_>::~unique_ptr
                  ((unique_ptr<mg::data::MappedMrg,_std::default_delete<mg::data::MappedMrg>_> *)
                   &local_38);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)auStack_58);
        std::__cxx11::string::~string((string *)(nam_filename.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)(mrg_filename.field_2._M_local_buf + 8));
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&mrg_data);
    }
    else {
      iVar3 = -1;
    }
    std::__cxx11::string::~string((string *)(nam_raw.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(name_info.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(compress_info.field_2._M_local_buf + 8));
  }
  return iVar3;
}

Assistant:

int main(int argc, char **argv) {
  // Parse args
  bool csv = false;
  const char *input_basename = nullptr;

  for (int i = 1; i < argc; i++) {
    if (!strcmp(argv[i], "--csv")) {
      csv = true;
      continue;
    }
    if (input_basename == nullptr) {
      input_basename = argv[i];
      continue;
    }
    usage(argv[0]);
    return -1;
  }

  if (input_basename == nullptr) {
    usage(argv[0]);
    return -1;
  }

  // Test for input files
  const std::string hed_filename = mg::string::format("%s.hed", input_basename);
  const std::string mrg_filename = mg::string::format("%s.mrg", input_basename);

  // Read raw data for hed files
  std::string hed_raw;
  if (!mg::fs::read_file(hed_filename.c_str(), hed_raw)) {
    return -1;
  }

  // Try and map the mrg data
  std::shared_ptr<mg::fs::MappedFile> mrg_data =
      mg::fs::MappedFile::open(mrg_filename.c_str());
  if (mrg_data == nullptr) {
    return -1;
  }

  // Try and read the NAM table as well. If we can't that's OK
  const std::string nam_filename = mg::string::format("%s.nam", input_basename);
  std::string nam_raw;
  mg::data::Nam nam;
  const bool has_nam = mg::fs::read_file(nam_filename.c_str(), nam_raw) &&
                       nam_read(nam_raw, nam);

  // Parse the MRG data
  auto mrg = mg::data::MappedMrg::parse(hed_raw, mrg_data);
  if (mrg == nullptr) {
    return -1;
  }

  // If we have a NAM and MRG, assert that the filename count matches the entry
  // count
  if (has_nam && mrg->entries().size() != nam.names.size()) {
    fprintf(stderr,
            "MRG entry count (%lu) does not match NAM entry count (%lu)\n",
            mrg->entries().size(), nam.names.size());
    return -1;
  }

  // Print some info
  for (unsigned i = 0; i < mrg->entries().size(); i++) {
    const std::string name_info =
        !has_nam ? ""
                 : mg::string::format(", Name: '%s'", nam.names[i].c_str());
    const bool is_compressed = mrg->entries()[i].size_sectors !=
                               mrg->entries()[i].size_uncompressed_sectors;
    const std::string compress_info =
        !is_compressed
            ? ""
            : mg::string::format(", Uncompressed size 0x%08x sectors",
                                 mrg->entries()[i].size_uncompressed_sectors);
    if (csv) {
      printf("%u,0x%08x,0x%08x,0x%08x,%s\n", i, mrg->entries()[i].offset,
             mrg->entries()[i].size_sectors,
             mrg->entries()[i].size_uncompressed_sectors,
             has_nam ? nam.names[i].c_str() : "");
    } else {
      printf("Entry %8u: Offset 0x%08x, Size 0x%08x sectors%s%s\n", i,
             mrg->entries()[i].offset, mrg->entries()[i].size_sectors,
             compress_info.c_str(), name_info.c_str());
    }
  }

  return 0;
}